

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void s_print(re_guts *g,FILE *d)

{
  cset *pcVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar7;
  long local_48;
  sopno offset;
  int last;
  int col;
  sop opnd;
  int done;
  int i;
  cset *cs;
  sop *s;
  FILE *d_local;
  re_guts *g_local;
  ulong uVar6;
  
  bVar2 = false;
  offset._4_4_ = 0;
  local_48 = 2;
  if ((*g->strip & 0x7c000000U) != 0x4000000) {
    fprintf((FILE *)d,"missing initial OEND!\n");
  }
  cs = (cset *)g->strip;
  while (cs = (cset *)&cs->mask, !bVar2) {
    uVar4 = (uint)cs->ptr & 0x3ffffff;
    uVar6 = (ulong)uVar4;
    uVar5 = (uint)cs->ptr & 0x7c000000;
    if (uVar5 == 0x4000000) {
      fprintf((FILE *)d,"\n");
      bVar2 = true;
    }
    else if (uVar5 == 0x8000000) {
      cVar3 = (char)uVar4;
      pcVar7 = strchr("\\|()^$.[+*?{}!<> ",(int)cVar3);
      if (pcVar7 == (char *)0x0) {
        pcVar7 = regchar((int)cVar3);
        fprintf((FILE *)d,"%s",pcVar7);
      }
      else {
        fprintf((FILE *)d,"\\%c",(ulong)(uint)(int)cVar3);
      }
    }
    else if (uVar5 == 0xc000000) {
      fprintf((FILE *)d,"^");
    }
    else if (uVar5 == 0x10000000) {
      fprintf((FILE *)d,"$");
    }
    else if (uVar5 == 0x14000000) {
      fprintf((FILE *)d,".");
    }
    else if (uVar5 == 0x18000000) {
      fprintf((FILE *)d,"[(%ld)",uVar6);
      pcVar1 = g->sets;
      offset._0_4_ = 0xffffffff;
      for (opnd._4_4_ = 0; (int)opnd._4_4_ < g->csetsize + 1; opnd._4_4_ = opnd._4_4_ + 1) {
        if (((pcVar1[uVar6].ptr[opnd._4_4_ & 0xff] & pcVar1[uVar6].mask) == 0) ||
           (g->csetsize <= (int)opnd._4_4_)) {
          if (-1 < (int)(uint)offset) {
            if ((uint)offset != opnd._4_4_ - 1) {
              pcVar7 = regchar(opnd._4_4_ - 1);
              fprintf((FILE *)d,"-%s",pcVar7);
            }
            offset._0_4_ = 0xffffffff;
          }
        }
        else if ((int)(uint)offset < 0) {
          pcVar7 = regchar(opnd._4_4_);
          fprintf((FILE *)d,"%s",pcVar7);
          offset._0_4_ = opnd._4_4_;
        }
      }
      fprintf((FILE *)d,"]");
    }
    else if (uVar5 == 0x1c000000) {
      fprintf((FILE *)d,"(\\<%ld>",uVar6);
    }
    else if (uVar5 == 0x20000000) {
      fprintf((FILE *)d,"<%ld>\\)",uVar6);
    }
    else if (uVar5 == 0x24000000) {
      fprintf((FILE *)d,"(+");
      if (((ulong)(&cs->ptr)[uVar6] & 0x7c000000) != 0x28000000) {
        fprintf((FILE *)d,"<%ld>",uVar6);
      }
    }
    else if (uVar5 == 0x28000000) {
      if ((*(ulong *)((long)cs + uVar6 * -8) & 0x7c000000) != 0x24000000) {
        fprintf((FILE *)d,"<%ld>",uVar6);
      }
      fprintf((FILE *)d,"+)");
    }
    else if (uVar5 == 0x2c000000) {
      fprintf((FILE *)d,"(?");
      if (((ulong)(&cs->ptr)[uVar6] & 0x7c000000) != 0x30000000) {
        fprintf((FILE *)d,"<%ld>",uVar6);
      }
    }
    else if (uVar5 == 0x30000000) {
      if ((*(ulong *)((long)cs + uVar6 * -8) & 0x7c000000) != 0x2c000000) {
        fprintf((FILE *)d,"<%ld>",uVar6);
      }
      fprintf((FILE *)d,"?)");
    }
    else if (uVar5 == 0x34000000) {
      fprintf((FILE *)d,"((<%ld>",uVar6);
    }
    else if (uVar5 == 0x38000000) {
      fprintf((FILE *)d,"<%ld>))",uVar6);
    }
    else if (uVar5 == 0x3c000000) {
      fprintf((FILE *)d,"<");
      if (((ulong)(&cs->ptr)[uVar6] & 0x7c000000) != 0x44000000) {
        fprintf((FILE *)d,"<%ld>",uVar6);
      }
    }
    else if (uVar5 == 0x40000000) {
      if (((*(ulong *)((long)cs + uVar6 * -8) & 0x7c000000) != 0x40000000) &&
         ((*(ulong *)((long)cs + uVar6 * -8) & 0x7c000000) != 0x3c000000)) {
        fprintf((FILE *)d,"<%ld>",uVar6);
      }
      fprintf((FILE *)d,"|");
    }
    else if (uVar5 == 0x44000000) {
      fprintf((FILE *)d,"|");
      if ((((ulong)(&cs->ptr)[uVar6] & 0x7c000000) != 0x44000000) &&
         (((ulong)(&cs->ptr)[uVar6] & 0x7c000000) != 0x48000000)) {
        fprintf((FILE *)d,"<%ld>",uVar6);
      }
    }
    else if (uVar5 == 0x48000000) {
      if ((*(ulong *)((long)cs + uVar6 * -8) & 0x7c000000) != 0x40000000) {
        fprintf((FILE *)d,"<%ld>",uVar6);
      }
      fprintf((FILE *)d,">");
    }
    else if (uVar5 == 0x4c000000) {
      fprintf((FILE *)d,"\\{");
    }
    else if (uVar5 == 0x50000000) {
      fprintf((FILE *)d,"\\}");
    }
    else {
      fprintf((FILE *)d,"!%ld(%ld)!",(ulong)cs->ptr & 0x7c000000);
    }
    if (!bVar2) {
      if (local_48 % 5 == 0) {
        if (offset._4_4_ < 0x29) {
          fprintf((FILE *)d," ");
          offset._4_4_ = offset._4_4_ + 1;
        }
        else {
          fprintf((FILE *)d,"\n\t");
          offset._4_4_ = 0;
        }
      }
      else {
        offset._4_4_ = offset._4_4_ + 1;
      }
      local_48 = local_48 + 1;
    }
  }
  return;
}

Assistant:

static void
s_print(g, d)
struct re_guts *g;
FILE *d;
{
	sop *s;
	cset *cs;
	int i;
	int done = 0;
	sop opnd;
	int col = 0;
	int last;
	sopno offset = 2;
#	define	GAP()	{	if (offset % 5 == 0) { \
					if (col > 40) { \
						fprintf(d, "\n\t"); \
						col = 0; \
					} else { \
						fprintf(d, " "); \
						col++; \
					} \
				} else \
					col++; \
				offset++; \
			}

	if (OP(g->strip[0]) != OEND)
		fprintf(d, "missing initial OEND!\n");
	for (s = &g->strip[1]; !done; s++) {
		opnd = OPND(*s);
		switch (OP(*s)) {
		case OEND:
			fprintf(d, "\n");
			done = 1;
			break;
		case OCHAR:
			if (strchr("\\|()^$.[+*?{}!<> ", (char)opnd) != NULL)
				fprintf(d, "\\%c", (char)opnd);
			else
				fprintf(d, "%s", regchar((char)opnd));
			break;
		case OBOL:
			fprintf(d, "^");
			break;
		case OEOL:
			fprintf(d, "$");
			break;
		case OBOW:
			fprintf(d, "\\{");
			break;
		case OEOW:
			fprintf(d, "\\}");
			break;
		case OANY:
			fprintf(d, ".");
			break;
		case OANYOF:
			fprintf(d, "[(%ld)", (long)opnd);
			cs = &g->sets[opnd];
			last = -1;
			for (i = 0; i < g->csetsize+1; i++)	/* +1 flushes */
				if (CHIN(cs, i) && i < g->csetsize) {
					if (last < 0) {
						fprintf(d, "%s", regchar(i));
						last = i;
					}
				} else {
					if (last >= 0) {
						if (last != i-1)
							fprintf(d, "-%s",
								regchar(i-1));
						last = -1;
					}
				}
			fprintf(d, "]");
			break;
		case OBACK_:
			fprintf(d, "(\\<%ld>", (long)opnd);
			break;
		case O_BACK:
			fprintf(d, "<%ld>\\)", (long)opnd);
			break;
		case OPLUS_:
			fprintf(d, "(+");
			if (OP(*(s+opnd)) != O_PLUS)
				fprintf(d, "<%ld>", (long)opnd);
			break;
		case O_PLUS:
			if (OP(*(s-opnd)) != OPLUS_)
				fprintf(d, "<%ld>", (long)opnd);
			fprintf(d, "+)");
			break;
		case OQUEST_:
			fprintf(d, "(?");
			if (OP(*(s+opnd)) != O_QUEST)
				fprintf(d, "<%ld>", (long)opnd);
			break;
		case O_QUEST:
			if (OP(*(s-opnd)) != OQUEST_)
				fprintf(d, "<%ld>", (long)opnd);
			fprintf(d, "?)");
			break;
		case OLPAREN:
			fprintf(d, "((<%ld>", (long)opnd);
			break;
		case ORPAREN:
			fprintf(d, "<%ld>))", (long)opnd);
			break;
		case OCH_:
			fprintf(d, "<");
			if (OP(*(s+opnd)) != OOR2)
				fprintf(d, "<%ld>", (long)opnd);
			break;
		case OOR1:
			if (OP(*(s-opnd)) != OOR1 && OP(*(s-opnd)) != OCH_)
				fprintf(d, "<%ld>", (long)opnd);
			fprintf(d, "|");
			break;
		case OOR2:
			fprintf(d, "|");
			if (OP(*(s+opnd)) != OOR2 && OP(*(s+opnd)) != O_CH)
				fprintf(d, "<%ld>", (long)opnd);
			break;
		case O_CH:
			if (OP(*(s-opnd)) != OOR1)
				fprintf(d, "<%ld>", (long)opnd);
			fprintf(d, ">");
			break;
		default:
			fprintf(d, "!%ld(%ld)!", OP(*s), opnd);
			break;
		}
		if (!done)
			GAP();
	}
}